

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void __thiscall btDbvt::clear(btDbvt *this)

{
  btDbvt *in_RDI;
  btDbvtNode *in_stack_ffffffffffffffe8;
  
  if (in_RDI->m_root != (btDbvtNode *)0x0) {
    recursedeletenode(in_RDI,in_stack_ffffffffffffffe8);
  }
  btAlignedFreeInternal((void *)0x15cad4);
  in_RDI->m_free = (btDbvtNode *)0x0;
  in_RDI->m_lkhd = -1;
  btAlignedObjectArray<btDbvt::sStkNN>::clear((btAlignedObjectArray<btDbvt::sStkNN> *)in_RDI);
  in_RDI->m_opath = 0;
  return;
}

Assistant:

void			btDbvt::clear()
{
	if(m_root)	
		recursedeletenode(this,m_root);
	btAlignedFree(m_free);
	m_free=0;
	m_lkhd		=	-1;
	m_stkStack.clear();
	m_opath		=	0;
	
}